

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_type_test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2aa72::FieldTypeTest_TestValueOfCodeReturnsSameFieldType_Test::TestBody
          (FieldTypeTest_TestValueOfCodeReturnsSameFieldType_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_c8;
  Message local_c0;
  FieldTypeEnum local_b2 [2];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_3;
  Message local_98;
  FieldTypeEnum local_8a [2];
  undefined1 local_88 [8];
  AssertionResult gtest_ar_2;
  Message local_70;
  FieldTypeEnum local_62 [2];
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_48;
  Message local_40 [3];
  FieldTypeEnum local_22 [2];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  FieldTypeTest_TestValueOfCodeReturnsSameFieldType_Test *this_local;
  
  local_22[1] = 0x44;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  local_22[0] = bidfx_public_api::price::pixie::FieldTypeMethods::ValueOf(0x44);
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::price::pixie::FieldTypeEnum,bidfx_public_api::price::pixie::FieldTypeEnum>
            ((EqHelper<false> *)local_20,"FieldTypeEnum::DOUBLE",
             "FieldTypeMethods::ValueOf((int) FieldTypeEnum::DOUBLE)",local_22 + 1,local_22);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_type_test.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message(local_40);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_62[1] = 0x49;
    local_62[0] = bidfx_public_api::price::pixie::FieldTypeMethods::ValueOf(0x49);
    testing::internal::EqHelper<false>::
    Compare<bidfx_public_api::price::pixie::FieldTypeEnum,bidfx_public_api::price::pixie::FieldTypeEnum>
              ((EqHelper<false> *)local_60,"FieldTypeEnum::INTEGER",
               "FieldTypeMethods::ValueOf((int) FieldTypeEnum::INTEGER)",local_62 + 1,local_62);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
    if (!bVar1) {
      testing::Message::Message(&local_70);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_type_test.cpp"
                 ,0x1c,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_70);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_8a[1] = 0x4c;
      local_8a[0] = bidfx_public_api::price::pixie::FieldTypeMethods::ValueOf(0x4c);
      testing::internal::EqHelper<false>::
      Compare<bidfx_public_api::price::pixie::FieldTypeEnum,bidfx_public_api::price::pixie::FieldTypeEnum>
                ((EqHelper<false> *)local_88,"FieldTypeEnum::LONG",
                 "FieldTypeMethods::ValueOf((int) FieldTypeEnum::LONG)",local_8a + 1,local_8a);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
      if (!bVar1) {
        testing::Message::Message(&local_98);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_type_test.cpp"
                   ,0x1d,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_98);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_98);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_b2[1] = 0x53;
        local_b2[0] = bidfx_public_api::price::pixie::FieldTypeMethods::ValueOf(0x53);
        testing::internal::EqHelper<false>::
        Compare<bidfx_public_api::price::pixie::FieldTypeEnum,bidfx_public_api::price::pixie::FieldTypeEnum>
                  ((EqHelper<false> *)local_b0,"FieldTypeEnum::STRING",
                   "FieldTypeMethods::ValueOf((int) FieldTypeEnum::STRING)",local_b2 + 1,local_b2);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
        if (!bVar1) {
          testing::Message::Message(&local_c0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
          testing::internal::AssertHelper::AssertHelper
                    (&local_c8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_type_test.cpp"
                     ,0x1e,pcVar2);
          testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_c8);
          testing::Message::~Message(&local_c0);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
      }
    }
  }
  return;
}

Assistant:

TEST(FieldTypeTest, TestValueOfCodeReturnsSameFieldType)
{
    ASSERT_EQ(FieldTypeEnum::DOUBLE, FieldTypeMethods::ValueOf((int) FieldTypeEnum::DOUBLE));
    ASSERT_EQ(FieldTypeEnum::INTEGER, FieldTypeMethods::ValueOf((int) FieldTypeEnum::INTEGER));
    ASSERT_EQ(FieldTypeEnum::LONG, FieldTypeMethods::ValueOf((int) FieldTypeEnum::LONG));
    ASSERT_EQ(FieldTypeEnum::STRING, FieldTypeMethods::ValueOf((int) FieldTypeEnum::STRING));
}